

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O1

bool __thiscall GlobOpt::CanCSEArrayStore(GlobOpt *this,Instr *instr)

{
  Opnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType baseValueType;
  
  this_00 = instr->m_dst;
  OVar2 = IR::Opnd::GetKind(this_00);
  if (OVar2 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                       ,0x38a,"(arrayOpnd->IsIndirOpnd())","arrayOpnd->IsIndirOpnd()");
    if (!bVar3) goto LAB_0049e900;
    *puVar4 = 0;
  }
  OVar2 = IR::Opnd::GetKind(this_00);
  if (OVar2 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) {
LAB_0049e900:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_1a[0] = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(this_00[1]._vptr_Opnd + 1);
  bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_1a[0].field_0);
  return bVar3;
}

Assistant:

bool
GlobOpt::CanCSEArrayStore(IR::Instr *instr)
{
    IR::Opnd *arrayOpnd = instr->GetDst();
    Assert(arrayOpnd->IsIndirOpnd());
    IR::RegOpnd *baseOpnd = arrayOpnd->AsIndirOpnd()->GetBaseOpnd();

    ValueType baseValueType(baseOpnd->GetValueType());

    // Only handle definite arrays for now.  Typed Arrays would require truncation of the CSE'd value.
    if (!baseValueType.IsArrayOrObjectWithArray())
    {
        return false;
    }

    return true;
}